

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O2

pool_ptr<soul::AST::ProcessorBase> __thiscall
soul::ASTUtilities::scanForProcessorToUseAsMain(ASTUtilities *this,ModuleBase *module)

{
  int iVar1;
  undefined4 extraout_var;
  ProcessorBase *pPVar3;
  Property *pPVar4;
  pool_ptr<soul::AST::ProcessorBase> pVar5;
  undefined8 *extraout_RDX;
  pool_ptr<soul::AST::ProcessorBase> p1;
  pool_ptr<soul::AST::ProcessorBase> p2;
  pool_ptr<soul::AST::ProcessorBase> local_48;
  ProcessorBase *local_40;
  pool_ref<soul::AST::ModuleBase> local_38;
  undefined8 *puVar2;
  
  *(undefined8 *)this = 0;
  iVar1 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  puVar2 = (undefined8 *)CONCAT44(extraout_var,iVar1);
  do {
    if (puVar2 == extraout_RDX) {
      return (pool_ptr<soul::AST::ProcessorBase>)(ProcessorBase *)this;
    }
    local_38.object = (ModuleBase *)*puVar2;
    cast<soul::AST::ProcessorBase,soul::AST::ModuleBase>((soul *)&local_48,&local_38);
    if ((local_48.object == (ProcessorBase *)0x0) ||
       (pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_48),
       (pPVar3->owningInstance).object != (ProcessorInstance *)0x0)) {
LAB_0021bee5:
      scanForProcessorToUseAsMain((ASTUtilities *)&local_40,(ModuleBase *)*puVar2);
      pVar5.object = local_40;
      if (local_40 != (ProcessorBase *)0x0) goto LAB_0021befa;
    }
    else {
      pPVar3 = pool_ptr<soul::AST::ProcessorBase>::operator->(&local_48);
      pPVar4 = AST::Annotation::findProperty<char[5]>(&pPVar3->annotation,(char (*) [5])"main");
      pVar5.object = local_48.object;
      if (pPVar4 != (Property *)0x0) goto LAB_0021bee5;
LAB_0021befa:
      *(ProcessorBase **)this = pVar5.object;
    }
    puVar2 = puVar2 + 1;
  } while( true );
}

Assistant:

static pool_ptr<AST::ProcessorBase> scanForProcessorToUseAsMain (AST::ModuleBase& module)
    {
        pool_ptr<AST::ProcessorBase> lastProcessor;

        for (auto& m : module.getSubModules())
        {
            auto p1 = cast<AST::ProcessorBase> (m);

            if (p1 != nullptr && ! p1->isSpecialisedInstance() && p1->annotation.findProperty ("main") == nullptr)
                lastProcessor = p1;
            else if (auto p2 = scanForProcessorToUseAsMain (m))
                lastProcessor = p2;
        }

        return lastProcessor;
    }